

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZoneFormat::parseExemplarLocation
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UnicodeString *tzID)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined4 extraout_var;
  int32_t i;
  int idx;
  UErrorCode status;
  int local_34;
  MatchInfoCollection *this_00;
  
  uVar2 = pos->index;
  UnicodeString::setToBogus(tzID);
  local_34 = 0;
  iVar3 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xf])
                    (this->fTimeZoneNames,text,(ulong)uVar2,0x40,&local_34);
  this_00 = (MatchInfoCollection *)CONCAT44(extraout_var,iVar3);
  if (local_34 < 1) {
    if (this_00 != (MatchInfoCollection *)0x0) {
      idx = 0;
      iVar3 = -1;
      iVar5 = -1;
      while( true ) {
        iVar4 = TimeZoneNames::MatchInfoCollection::size(this_00);
        if (iVar4 <= idx) break;
        iVar4 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_00,idx);
        if (iVar3 < (int)(iVar4 + uVar2)) {
          iVar5 = TimeZoneNames::MatchInfoCollection::getMatchLengthAt(this_00,idx);
          iVar3 = iVar5 + uVar2;
          iVar5 = idx;
        }
        idx = idx + 1;
      }
      if (0 < iVar3) {
        pos->index = iVar3;
        getTimeZoneID(this,this_00,iVar5,tzID);
      }
    }
    sVar1 = (tzID->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (tzID->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 != 0) goto LAB_0020f36a;
  }
  pos->errorIndex = uVar2;
LAB_0020f36a:
  if (this_00 != (MatchInfoCollection *)0x0) {
    (*this_00->_vptr_MatchInfoCollection[1])(this_00);
  }
  return tzID;
}

Assistant:

UnicodeString&
TimeZoneFormat::parseExemplarLocation(const UnicodeString& text, ParsePosition& pos, UnicodeString& tzID) const {
    int32_t startIdx = pos.getIndex();
    int32_t parsedPos = -1;
    tzID.setToBogus();

    UErrorCode status = U_ZERO_ERROR;
    LocalPointer<TimeZoneNames::MatchInfoCollection> exemplarMatches(fTimeZoneNames->find(text, startIdx, UTZNM_EXEMPLAR_LOCATION, status));
    if (U_FAILURE(status)) {
        pos.setErrorIndex(startIdx);
        return tzID;
    }
    int32_t matchIdx = -1;
    if (!exemplarMatches.isNull()) {
        for (int32_t i = 0; i < exemplarMatches->size(); i++) {
            if (startIdx + exemplarMatches->getMatchLengthAt(i) > parsedPos) {
                matchIdx = i;
                parsedPos = startIdx + exemplarMatches->getMatchLengthAt(i);
            }
        }
        if (parsedPos > 0) {
            pos.setIndex(parsedPos);
            getTimeZoneID(exemplarMatches.getAlias(), matchIdx, tzID);
        }
    }

    if (tzID.length() == 0) {
        pos.setErrorIndex(startIdx);
    }

    return tzID;
}